

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnTable
          (BinaryReaderObjdump *this,Index index,Type elem_type,Limits *elem_limits)

{
  bool bVar1;
  undefined8 uVar2;
  size_type sVar3;
  const_pointer pvVar4;
  undefined1 local_60 [8];
  string_view name;
  Limits *elem_limits_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  Type elem_type_local;
  
  unique0x1000018e = elem_type;
  Type::GetName_abi_cxx11_((string *)&name._M_str,(Type *)((long)&this_local + 4));
  uVar2 = std::__cxx11::string::c_str();
  PrintDetails(this," - table[%u] type=%s initial=%ld",(ulong)index,uVar2,elem_limits->initial);
  std::__cxx11::string::~string((string *)&name._M_str);
  if ((elem_limits->has_max & 1U) != 0) {
    PrintDetails(this," max=%ld",elem_limits->max);
  }
  _local_60 = BinaryReaderObjdumpBase::GetTableName(&this->super_BinaryReaderObjdumpBase,index);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
  if (!bVar1) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
    PrintDetails(this," <%.*s>",sVar3 & 0xffffffff,pvVar4);
  }
  PrintDetails(this,"\n");
  Result::Result((Result *)&elem_type_local,Ok);
  return (Result)elem_type_local.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnTable(Index index,
                                    Type elem_type,
                                    const Limits* elem_limits) {
  PrintDetails(" - table[%" PRIindex "] type=%s initial=%" PRId64, index,
               elem_type.GetName().c_str(), elem_limits->initial);
  if (elem_limits->has_max) {
    PrintDetails(" max=%" PRId64, elem_limits->max);
  }
  auto name = GetTableName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  return Result::Ok;
}